

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  char **ppcVar1;
  char **ppcVar2;
  char *local_88;
  char *reservedTargets [15];
  string *name_local;
  
  reservedTargets[0xe] = (char *)name;
  memcpy(&local_88,&DAT_00bbfdd0,0x78);
  ppcVar1 = cmArrayBegin<char_const*,15ul>((char *(*) [15])&local_88);
  ppcVar2 = cmArrayEnd<char_const*,15ul>((char *(*) [15])&local_88);
  ppcVar1 = std::find<char_const*const*,std::__cxx11::string>
                      (ppcVar1,ppcVar2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       reservedTargets[0xe]);
  ppcVar2 = cmArrayEnd<char_const*,15ul>((char *(*) [15])&local_88);
  return ppcVar1 != ppcVar2;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  const char* reservedTargets[] = {
    "all",        "ALL_BUILD", "help",       "install",        "INSTALL",
    "preinstall", "clean",     "edit_cache", "rebuild_cache",  "test",
    "RUN_TESTS",  "package",   "PACKAGE",    "package_source", "ZERO_CHECK"
  };

  return std::find(cmArrayBegin(reservedTargets), cmArrayEnd(reservedTargets),
                   name) != cmArrayEnd(reservedTargets);
}